

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

SizeRange * __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::mutable_widthrange
          (ImageFeatureType_ImageSizeRange *this)

{
  SizeRange *pSVar1;
  SizeRange *_msg;
  ImageFeatureType_ImageSizeRange *this_local;
  
  pSVar1 = _internal_mutable_widthrange(this);
  return pSVar1;
}

Assistant:

inline ::CoreML::Specification::SizeRange* ImageFeatureType_ImageSizeRange::mutable_widthrange() {
  ::CoreML::Specification::SizeRange* _msg = _internal_mutable_widthrange();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.ImageSizeRange.widthRange)
  return _msg;
}